

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitPrefixUnaryExpression
          (SyntaxDumper *this,PrefixUnaryExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_50;
  PrefixUnaryExpressionSyntax *local_18;
  PrefixUnaryExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (PrefixUnaryExpressionSyntax *)this;
  traverseExpression(this,(ExpressionSyntax *)node);
  PrefixUnaryExpressionSyntax::operatorToken(&local_50,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pEVar1 = PrefixUnaryExpressionSyntax::expression(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  return Skip;
}

Assistant:

virtual Action visitPrefixUnaryExpression(const PrefixUnaryExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->operatorToken(), node);
        nonterminal(node->expression());
        return Action::Skip;
    }